

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3_set_auxdata(sqlite3_context *pCtx,int iArg,void *pAux,_func_void_void_ptr *xDelete)

{
  Vdbe *pVVar1;
  Vdbe *pVdbe;
  AuxData *pAuxData;
  _func_void_void_ptr *xDelete_local;
  void *pAux_local;
  int iArg_local;
  sqlite3_context *pCtx_local;
  
  pVVar1 = pCtx->pVdbe;
  pVdbe = (Vdbe *)pVVar1->pAuxData;
  while ((pVdbe != (Vdbe *)0x0 &&
         ((*(int *)((long)&pVdbe->db + 4) != iArg ||
          ((*(int *)&pVdbe->db != pCtx->iOp && (-1 < iArg))))))) {
    pVdbe = (Vdbe *)pVdbe->pParse;
  }
  if (pVdbe == (Vdbe *)0x0) {
    pVdbe = (Vdbe *)sqlite3DbMallocZero(pVVar1->db,0x20);
    if (pVdbe == (Vdbe *)0x0) {
      if (xDelete == (_func_void_void_ptr *)0x0) {
        return;
      }
      (*xDelete)(pAux);
      return;
    }
    *(int *)&pVdbe->db = pCtx->iOp;
    *(int *)((long)&pVdbe->db + 4) = iArg;
    pVdbe->pParse = (Parse *)pVVar1->pAuxData;
    pVVar1->pAuxData = (AuxData *)pVdbe;
    if (pCtx->fErrorOrAux == '\0') {
      pCtx->isError = 0;
      pCtx->fErrorOrAux = '\x01';
    }
  }
  else if (pVdbe->pNext != (Vdbe *)0x0) {
    (*(code *)pVdbe->pNext)(pVdbe->pPrev);
  }
  pVdbe->pPrev = (Vdbe *)pAux;
  pVdbe->pNext = (Vdbe *)xDelete;
  return;
}

Assistant:

SQLITE_API void sqlite3_set_auxdata(
  sqlite3_context *pCtx, 
  int iArg, 
  void *pAux, 
  void (*xDelete)(void*)
){
  AuxData *pAuxData;
  Vdbe *pVdbe = pCtx->pVdbe;

  assert( sqlite3_mutex_held(pCtx->pOut->db->mutex) );
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
  if( pVdbe==0 ) goto failed;
#else
  assert( pVdbe!=0 );
#endif

  for(pAuxData=pVdbe->pAuxData; pAuxData; pAuxData=pAuxData->pNextAux){
    if( pAuxData->iAuxArg==iArg && (pAuxData->iAuxOp==pCtx->iOp || iArg<0) ){
      break;
    }
  }
  if( pAuxData==0 ){
    pAuxData = sqlite3DbMallocZero(pVdbe->db, sizeof(AuxData));
    if( !pAuxData ) goto failed;
    pAuxData->iAuxOp = pCtx->iOp;
    pAuxData->iAuxArg = iArg;
    pAuxData->pNextAux = pVdbe->pAuxData;
    pVdbe->pAuxData = pAuxData;
    if( pCtx->fErrorOrAux==0 ){
      pCtx->isError = 0;
      pCtx->fErrorOrAux = 1;
    }
  }else if( pAuxData->xDeleteAux ){
    pAuxData->xDeleteAux(pAuxData->pAux);
  }

  pAuxData->pAux = pAux;
  pAuxData->xDeleteAux = xDelete;
  return;

failed:
  if( xDelete ){
    xDelete(pAux);
  }
}